

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O1

void __thiscall
CompositedBupOutputter::setBase(CompositedBupOutputter *this,path *basePath,Image *img,string *name)

{
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var2;
  
  if (&this->basePath != basePath) {
    std::__cxx11::string::operator=((string *)&this->basePath,(string *)basePath);
    _Var1._M_head_impl =
         (basePath->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    (basePath->_M_cmpts)._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (_Impl *)0x0;
    _Var2._M_head_impl =
         (this->basePath)._M_cmpts._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    (this->basePath)._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    if (_Var2._M_head_impl != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&(this->basePath)._M_cmpts,_Var2._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear(basePath);
  }
  (this->base).size = img->size;
  std::vector<Color,_std::allocator<Color>_>::_M_move_assign
            (&(this->base).colorData,&img->colorData);
  std::__cxx11::string::operator=((string *)&this->baseName,(string *)name);
  std::__cxx11::string::_M_replace
            ((ulong)&this->withFaceName,0,(char *)(this->withFaceName)._M_string_length,0x1163d1);
  std::__cxx11::string::_M_replace
            ((ulong)&this->withMouthName,0,(char *)(this->withMouthName)._M_string_length,0x1163d1);
  return;
}

Assistant:

void setBase(fs::path basePath, Image img, std::string name) override {
		this->basePath = std::move(basePath);
		base = std::move(img);
		baseName = std::move(name);
		withFaceName = "";
		withMouthName = "";
	}